

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITypeReader.cpp
# Opt level: O2

void __thiscall ITypeReader::getWord(ITypeReader *this,string *str)

{
  char ch;
  bool bVar1;
  char cVar2;
  string local_60;
  string local_40 [32];
  
  while (ch = std::istream::get(), ch != -1) {
    bVar1 = IDictionary::isLetterOrNumberOrDL(ch);
    cVar2 = (char)str;
    if (!bVar1) goto LAB_00108a64;
    std::__cxx11::string::push_back(cVar2);
  }
LAB_00108aa6:
  while (bVar1 = IDictionary::isBlankSep((str->_M_dataplus)._M_p[str->_M_string_length - 1]), bVar1)
  {
    std::__cxx11::string::substr((ulong)local_40,(ulong)str);
    std::__cxx11::string::operator=((string *)str,local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::__cxx11::string::string((string *)&local_60,(string *)str);
  bVar1 = IDictionary::isBaseType(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    std::__cxx11::string::assign((char *)str);
  }
  if (str->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->m_last);
  }
  return;
LAB_00108a64:
  while (bVar1 = IDictionary::isBlankSep(ch), (~bVar1 & ch != '*') == 0) {
    std::__cxx11::string::push_back(cVar2);
    if (ch == '\n') {
      std::__cxx11::string::push_back(cVar2);
    }
    ch = std::istream::get();
  }
  goto LAB_00108aa6;
}

Assistant:

void ITypeReader::getWord(std::string &str) {
    char tempChar;

    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isLetterOrNumberOrDL(tempChar))
        {
            str+=tempChar;
        }
        else
        {
            while(IDictionary::isBlankSep(tempChar)||tempChar=='*')
            {
                str+=tempChar;
                if(tempChar=='\n')
                    str+='\n';
                tempChar = this->m_ifs->get();
            }
            break;
        }
    }
    while(IDictionary::isBlankSep(str[str.length()-1]))
        str=str.substr(0,str.length()-1);

    if(!IDictionary::isBaseType(str))
    {
        str="";
    }

    if(!str.empty())
    {
        m_last=str;
    }
}